

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O0

void __thiscall
Spaghetti<UFPC>::PerformLabelingMem
          (Spaghetti<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  uint uVar4;
  uchar *puVar5;
  uint *puVar6;
  int *piVar7;
  reference pvVar8;
  double dVar9;
  Mat_<int> local_2e0;
  allocator<unsigned_long> local_279;
  value_type_conflict2 local_278;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_270;
  uint local_254;
  int local_250;
  int iLabel;
  int c_4;
  int r_4;
  int c_3;
  int r_3;
  int c_2;
  int r_2;
  int c_1;
  int r_1;
  int c;
  int r;
  undefined1 local_220 [8];
  MemMat<int> img_labels;
  Mat_<unsigned_char> local_148;
  undefined1 local_e8 [8];
  MemMat<unsigned_char> img;
  int w;
  int h;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses_local;
  Spaghetti<UFPC> *this_local;
  
  img.accesses_._92_4_ =
       *(undefined4 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  img.accesses_._88_4_ =
       *(undefined4 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  UFPC::MemAlloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) * ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1)
                 + 1);
  UFPC::MemSetup();
  cv::Mat_<unsigned_char>::Mat_(&local_148,(this->super_Labeling2D<(Connectivity2D)8,_false>).img_);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_e8,&local_148);
  cv::Mat_<unsigned_char>::~Mat_(&local_148);
  cv::MatSize::operator()((MatSize *)&c);
  MemMat<int>::MemMat((MemMat<int> *)local_220,(Size *)&c,0);
  if (img.accesses_._92_4_ == 1) {
    r_1 = 0;
    c_1 = -2;
LAB_001666ee:
    c_1 = c_1 + 2;
    if (c_1 < img.accesses_._88_4_ + -2) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1);
      if (*puVar5 == '\0') goto LAB_0016683e;
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
      if (*puVar5 == '\0') {
        uVar4 = UFPC::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *puVar6 = uVar4;
      }
      else {
        uVar4 = UFPC::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *puVar6 = uVar4;
        while( true ) {
          while( true ) {
            c_1 = c_1 + 2;
            if (img.accesses_._88_4_ + -2 <= c_1) {
              if (img.accesses_._88_4_ + -2 < c_1) {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1,c_1);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar7 = 0;
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar7 = iVar1;
                }
              }
              else {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1,c_1);
                if (*puVar5 == '\0') goto LAB_00166bd3;
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar7 = iVar1;
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar7 = iVar1;
                }
              }
              goto LAB_00174243;
            }
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1);
            if (*puVar5 == '\0') break;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar7 = iVar1;
              goto LAB_001666ee;
            }
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar7 = iVar1;
          }
LAB_0016683e:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
          if (*puVar5 == '\0') break;
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *puVar6 = uVar4;
        }
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *piVar7 = 0;
      }
      goto LAB_001666ee;
    }
    if (img.accesses_._88_4_ + -2 < c_1) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1);
      if (*puVar5 == '\0') {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *piVar7 = 0;
      }
      else {
        uVar4 = UFPC::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *puVar6 = uVar4;
      }
    }
    else {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1);
      if (*puVar5 == '\0') {
LAB_00166bd3:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
        if (*puVar5 == '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *piVar7 = 0;
        }
        else {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *puVar6 = uVar4;
        }
      }
      else {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
        if (*puVar5 == '\0') {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *puVar6 = uVar4;
        }
        else {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *puVar6 = uVar4;
        }
      }
    }
  }
  else {
    r_2 = 0;
    c_2 = -2;
LAB_00166d69:
    c_2 = c_2 + 2;
    if (c_2 < img.accesses_._88_4_ + -2) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
      if ((*puVar5 == '\0') &&
         (puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2),
         *puVar5 == '\0')) goto LAB_00166ea1;
LAB_00166dd2:
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
      if (*puVar5 == '\0') {
        uVar4 = UFPC::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
        *puVar6 = uVar4;
        goto LAB_001670ef;
      }
      uVar4 = UFPC::MemNewLabel();
      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
      *puVar6 = uVar4;
LAB_00166f8b:
      do {
        c_2 = c_2 + 2;
        if (img.accesses_._88_4_ + -2 <= c_2) {
          if (img.accesses_._88_4_ + -2 < c_2) {
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2);
              if (*puVar5 == '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                *piVar7 = 0;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                *piVar7 = iVar1;
              }
            }
            else {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
              *piVar7 = iVar1;
            }
            goto LAB_00167a99;
          }
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
          if ((*puVar5 == '\0') &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2), *puVar5 == '\0'))
          goto LAB_00167795;
LAB_001678bb:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *piVar7 = iVar1;
          }
          else {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *piVar7 = iVar1;
          }
          goto LAB_00167a99;
        }
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
        if ((*puVar5 == '\0') &&
           (puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2), *puVar5 == '\0')) {
LAB_00166ea1:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
          if (*puVar5 == '\0') {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + 1);
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
              *piVar7 = 0;
              goto LAB_00166d69;
            }
            uVar4 = UFPC::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *puVar6 = uVar4;
          }
          else {
            uVar4 = UFPC::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *puVar6 = uVar4;
          }
        }
        else {
          while (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1), *puVar5 == '\0'
                ) {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *piVar7 = iVar1;
LAB_001670ef:
            while( true ) {
              c_2 = c_2 + 2;
              if (img.accesses_._88_4_ + -2 <= c_2) {
                if (img.accesses_._88_4_ + -2 < c_2) {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_2,c_2);
                  if ((*puVar5 == '\0') &&
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2),
                     *puVar5 == '\0')) {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                    *piVar7 = 0;
                    goto LAB_00167a99;
                  }
                }
                else {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_2,c_2);
                  if (*puVar5 != '\0') {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + -1);
                    if (*puVar5 == '\0') goto LAB_001676c9;
                    goto LAB_001678bb;
                  }
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2);
                  if (*puVar5 == '\0') goto LAB_00167795;
                  MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + -1);
                if (*puVar5 == '\0') {
                  uVar4 = UFPC::MemNewLabel();
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                  *puVar6 = uVar4;
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                  *piVar7 = iVar1;
                }
                goto LAB_00167a99;
              }
              puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
              if (*puVar5 != '\0') break;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2);
              if (*puVar5 == '\0') goto LAB_00166ea1;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
              if (*puVar5 != '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + -1);
                if (*puVar5 == '\0') {
                  uVar4 = UFPC::MemNewLabel();
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                  *puVar6 = uVar4;
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                  *piVar7 = iVar1;
                }
                goto LAB_00166f8b;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + -1);
              if (*puVar5 == '\0') {
                uVar4 = UFPC::MemNewLabel();
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                *puVar6 = uVar4;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                *piVar7 = iVar1;
              }
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + -1);
            if (*puVar5 == '\0') goto LAB_00166dd2;
          }
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *piVar7 = iVar1;
        }
      } while( true );
    }
    if (img.accesses_._88_4_ + -2 < c_2) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
      if (*puVar5 == '\0') {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2);
        if (*puVar5 == '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *piVar7 = 0;
        }
        else {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *puVar6 = uVar4;
        }
      }
      else {
        uVar4 = UFPC::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
        *puVar6 = uVar4;
      }
    }
    else {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
      if ((*puVar5 == '\0') &&
         (puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2),
         *puVar5 == '\0')) {
LAB_00167795:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
        if (*puVar5 == '\0') {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + 1);
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *piVar7 = 0;
          }
          else {
            uVar4 = UFPC::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *puVar6 = uVar4;
          }
        }
        else {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *puVar6 = uVar4;
        }
      }
      else {
LAB_001676c9:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
        if (*puVar5 == '\0') {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *puVar6 = uVar4;
        }
        else {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *puVar6 = uVar4;
        }
      }
    }
LAB_00167a99:
    for (r_3 = 2; r_3 < img.accesses_._92_4_ - (int)img.accesses_._92_4_ % 2; r_3 = r_3 + 2) {
      c_3 = 0;
      if (0 < img.accesses_._88_4_ + -2) {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,0);
        if (*puVar5 == '\0') {
LAB_00167f0c:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
          if (*puVar5 == '\0') goto LAB_0016802f;
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
          if (*puVar5 != '\0') goto LAB_00167f7a;
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
          *puVar6 = uVar4;
          goto LAB_0016b39c;
        }
LAB_00167b40:
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
        if (*puVar5 == '\0') {
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
          if (*puVar5 != '\0') goto LAB_00167bf4;
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3)
          ;
          if (*puVar5 == '\0') {
            uVar4 = UFPC::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *puVar6 = uVar4;
            goto LAB_0016bd3e;
          }
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
          *piVar7 = iVar1;
          goto LAB_0016bed6;
        }
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
        iVar1 = *piVar7;
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
        *piVar7 = iVar1;
LAB_0016c89f:
        do {
          c_3 = c_3 + 2;
          if (img.accesses_._88_4_ + -2 <= c_3) {
            if (img.accesses_._88_4_ + -2 < c_3) {
              puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3);
              if (*puVar5 == '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = 0;
                }
                else {
LAB_0016e42b:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                  if (*puVar5 == '\0') {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
                    if (*puVar5 == '\0') {
                      uVar4 = UFPC::MemNewLabel();
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                  }
                }
              }
              else {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
                if (*puVar5 == '\0') {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                  if (*puVar5 == '\0') {
LAB_0016e32d:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                  }
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
              }
              goto LAB_001704f8;
            }
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
              if (*puVar5 == '\0') goto LAB_0016e87e;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
              if (*puVar5 == '\0') goto LAB_0016e42b;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
              if (*puVar5 != '\0') goto LAB_0016f7bb;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
              if (*puVar5 == '\0') goto LAB_0016e75c;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
              if (*puVar5 == '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
                goto LAB_001704f8;
              }
            }
            else {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
              if ((*puVar5 == '\0') &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1),
                 *puVar5 == '\0')) {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                if (*puVar5 == '\0') goto LAB_0016e32d;
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                if (*puVar5 == '\0') {
LAB_0016ea65:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
                  if (*puVar5 == '\0') {
                    puVar6 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                    uVar4 = *puVar6;
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *puVar6 = uVar4;
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                  }
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
                goto LAB_001704f8;
              }
LAB_0016f7bb:
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
              if (*puVar5 == '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_001704f8;
              }
            }
LAB_0016f7f5:
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
              if (*puVar5 == '\0') {
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                uVar4 = *puVar6;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *puVar6 = uVar4;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
              }
            }
            else {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
            }
            goto LAB_001704f8;
          }
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3);
          if (*puVar5 == '\0') {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
            if (*puVar5 == '\0') goto LAB_0016802f;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
              if (*puVar5 != '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_0016b39c;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
              if (*puVar5 == '\0') {
                uVar4 = UFPC::MemNewLabel();
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *puVar6 = uVar4;
                goto LAB_0016b39c;
              }
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
              goto LAB_0016b39c;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
            if (*puVar5 != '\0') goto LAB_0016b19f;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
            if (*puVar5 == '\0') goto LAB_00167f7a;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
            if (*puVar5 != '\0') goto LAB_0016b1d9;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
            if (*puVar5 != '\0') goto LAB_0016ae67;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
            if (*puVar5 != '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
              goto LAB_00169e13;
            }
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *piVar7 = iVar1;
LAB_0016989f:
            do {
              c_3 = c_3 + 2;
              if (img.accesses_._88_4_ + -2 <= c_3) {
                if (img.accesses_._88_4_ + -2 < c_3) {
LAB_0016dda8:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                  if (*puVar5 == '\0') {
LAB_0016dd0c:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = 0;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                  }
                  goto LAB_001704f8;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                if (*puVar5 == '\0') {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                  if (*puVar5 == '\0') {
LAB_0016f24b:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                    if (*puVar5 == '\0') goto LAB_0016e8b7;
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                    if (*puVar5 == '\0') {
                      uVar4 = UFPC::MemNewLabel();
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                    goto LAB_001704f8;
                  }
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                    goto LAB_001704f8;
                  }
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
                else {
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                  uVar4 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *puVar6 = uVar4;
                }
                goto LAB_001704f8;
              }
              puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3);
              if (*puVar5 != '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                if (*puVar5 == '\0') {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                    goto LAB_0016cf9c;
                  }
LAB_001699f1:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                    goto LAB_0016b59a;
                  }
                  puVar6 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                  uVar4 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *puVar6 = uVar4;
                  goto LAB_0016a689;
                }
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                uVar4 = *puVar6;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *puVar6 = uVar4;
                goto LAB_0016c89f;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
              if (*puVar5 != '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                  goto LAB_0016b39c;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                if (*puVar5 != '\0') {
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                  uVar4 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *puVar6 = uVar4;
                  goto LAB_0016abdd;
                }
                goto LAB_001699f1;
              }
LAB_00169caa:
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
              if (*puVar5 == '\0') {
LAB_00168068:
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + 1);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = 0;
                  c_3 = c_3 + 2;
                  if (c_3 < img.accesses_._88_4_ + -2) {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                    if (*puVar5 == '\0') goto LAB_00167f0c;
LAB_00168155:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                    if (*puVar5 != '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                      if (*puVar5 == '\0') {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                        if (*puVar5 != '\0') goto LAB_00168241;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                      }
                      else {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                      }
                      goto LAB_0016c89f;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                    if (*puVar5 == '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                      if (*puVar5 == '\0') {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                        if (*puVar5 == '\0') {
                          uVar4 = UFPC::MemNewLabel();
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_0016bd3e;
                        }
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2)
                        ;
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                        goto LAB_0016bd3e;
                      }
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
LAB_0016bed6:
                      do {
                        c_3 = c_3 + 2;
                        if (img.accesses_._88_4_ + -2 <= c_3) {
                          if (img.accesses_._88_4_ + -2 < c_3) {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                            if (*puVar5 == '\0') {
LAB_0016de97:
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                                *piVar7 = 0;
                              }
                              else {
LAB_0016decf:
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + 1,
                                                    c_3 + -1);
                                if (*puVar5 == '\0') {
                                  uVar4 = UFPC::MemNewLabel();
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3);
                                  *puVar6 = uVar4;
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                              }
                              goto LAB_001704f8;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                            if (*puVar5 == '\0') goto LAB_0016d888;
                          }
                          else {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                            if (*puVar5 == '\0') {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                              if (*puVar5 == '\0') goto LAB_0016e87e;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                              if (*puVar5 == '\0') goto LAB_0016decf;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                            if (*puVar5 == '\0') goto LAB_0016e75c;
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                            if (*puVar5 != '\0') {
LAB_0016fe8b:
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,
                                                  c_3 + -1);
                              if (*puVar5 != '\0') goto LAB_0016f7f5;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3 + -2,c_3);
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3 + -2);
                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3);
                              *puVar6 = uVar4;
                              goto LAB_001704f8;
                            }
                          }
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                          if (*puVar5 == '\0') {
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                            iVar1 = *piVar7;
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                            *piVar7 = iVar1;
                          }
                          else {
LAB_0016e0b5:
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + -1)
                            ;
                            if (*puVar5 == '\0') {
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3 + -2,c_3);
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3 + -2);
                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3);
                              *puVar6 = uVar4;
                            }
                            else {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3 + -2,c_3);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                              *piVar7 = iVar1;
                            }
                          }
                          goto LAB_001704f8;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                        if (*puVar5 == '\0') {
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                          if (*puVar5 == '\0') goto LAB_0016802f;
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                          if (*puVar5 == '\0') goto LAB_0016b4e7;
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                          if (*puVar5 == '\0') goto LAB_00167f7a;
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                          if (*puVar5 != '\0') {
LAB_0016c7d2:
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + -1)
                            ;
                            if (*puVar5 != '\0') goto LAB_0016b1d9;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3 + -2,c_3);
                            uVar4 = *puVar6;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                            *puVar6 = uVar4;
LAB_0016abdd:
                            c_3 = c_3 + 2;
                            if (img.accesses_._88_4_ + -2 <= c_3) {
                              if (img.accesses_._88_4_ + -2 < c_3) goto LAB_0016dda8;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                              if (*puVar5 != '\0') goto LAB_0016f7bb;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                              if (*puVar5 == '\0') goto LAB_0016e87e;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                              if (*puVar5 != '\0') goto LAB_0016f7bb;
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3,c_3 + -2);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                              *piVar7 = iVar1;
                              goto LAB_001704f8;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                            if (*puVar5 == '\0') {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                              if (*puVar5 == '\0') goto LAB_0016802f;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                                *piVar7 = iVar1;
                                goto LAB_0016b39c;
                              }
LAB_0016b19f:
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1
                                                 );
                              if (*puVar5 != '\0') {
LAB_0016b1d9:
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                                if (*puVar5 == '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3
                                                     );
                                  if (*puVar5 == '\0') {
                                    puVar6 = (uint *)MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_3 + -2,
                                                                c_3);
                                    uVar4 = *puVar6;
                                    puVar6 = (uint *)MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_3,
                                                                c_3 + -2);
                                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                    puVar6 = (uint *)MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_3,c_3);
                                    *puVar6 = uVar4;
                                  }
                                  else {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                                    *piVar7 = iVar1;
                                  }
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                                goto LAB_0016abdd;
                              }
                            }
                            else {
LAB_0016ac46:
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1
                                                 );
                              if (*puVar5 != '\0') goto LAB_0016ac80;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                                *piVar7 = iVar1;
                                goto LAB_0016cf9c;
                              }
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
                            if (*puVar5 == '\0') {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3,c_3 + -2);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                              *piVar7 = iVar1;
                              goto LAB_0016b59a;
                            }
LAB_0016ae67:
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + 1);
                            if (*puVar5 == '\0') {
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2)
                              ;
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3 + -2);
                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3);
                              *puVar6 = uVar4;
                              goto LAB_0016a689;
                            }
LAB_0016aea2:
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                            if (*puVar5 == '\0') {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
                              if (*puVar5 == '\0') {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3 + -2,
                                                            c_3 + 2);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3);
                                *puVar6 = uVar4;
                              }
                              else {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                                *piVar7 = iVar1;
                              }
                            }
                            else {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                              *piVar7 = iVar1;
                            }
LAB_0016a689:
                            do {
                              c_3 = c_3 + 2;
                              if (img.accesses_._88_4_ + -2 <= c_3) {
                                if (img.accesses_._88_4_ + -2 < c_3) goto LAB_0016dda8;
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                                if (*puVar5 == '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3)
                                  ;
                                  if (*puVar5 == '\0') {
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3,
                                                        c_3 + 1);
                                    if (*puVar5 == '\0') goto LAB_0016e8b7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                                    *piVar7 = iVar1;
                                    goto LAB_001704f8;
                                  }
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1)
                                  ;
                                  if (*puVar5 == '\0') {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                                    *piVar7 = iVar1;
                                    goto LAB_001704f8;
                                  }
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                    c_3 + 1);
                                if (*puVar5 == '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                                goto LAB_001704f8;
                              }
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                              if (*puVar5 == '\0') {
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                                if (*puVar5 != '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1)
                                  ;
                                  if (*puVar5 == '\0') {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                                    *piVar7 = iVar1;
                                    goto LAB_0016b39c;
                                  }
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                      c_3 + 1);
                                  if (*puVar5 == '\0') goto LAB_0016a7a4;
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                  goto LAB_0016abdd;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                                if (*puVar5 == '\0') goto LAB_00168068;
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                    c_3 + 1);
                                if (*puVar5 != '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                  goto LAB_0016abdd;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                    c_3 + 2);
                                if (*puVar5 == '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                  goto LAB_00169e13;
                                }
LAB_00167c65:
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -2,
                                                    c_3 + 1);
                                if (*puVar5 == '\0') {
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3 + -2,c_3)
                                  ;
                                  uVar4 = *puVar6;
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3 + -2,
                                                              c_3 + 2);
                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3);
                                  *puVar6 = uVar4;
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                              }
                              else {
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                    c_3 + 1);
                                if (*puVar5 != '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                  goto LAB_0016c89f;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                                if (*puVar5 == '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                  goto LAB_0016cf9c;
                                }
LAB_0016a7a4:
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                    c_3 + 2);
                                if (*puVar5 == '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
LAB_0016b59a:
                                  do {
                                    c_3 = c_3 + 2;
                                    if (img.accesses_._88_4_ + -2 <= c_3) {
                                      if (img.accesses_._88_4_ + -2 < c_3) goto LAB_0016dda8;
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3,c_3)
                                      ;
                                      if (*puVar5 == '\0') {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + 1,c_3);
                                        if (*puVar5 == '\0') goto LAB_0016f24b;
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,r_3,
                                                            c_3 + 1);
                                        if (*puVar5 == '\0') {
                                          piVar7 = MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3 + -2)
                                          ;
                                          iVar1 = *piVar7;
                                          piVar7 = MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3);
                                          *piVar7 = iVar1;
                                          goto LAB_001704f8;
                                        }
                                      }
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1
                                                          ,c_3 + 1);
                                      if (*puVar5 == '\0') {
                                        piVar7 = MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                        iVar1 = *piVar7;
                                        piVar7 = MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3);
                                        *piVar7 = iVar1;
                                      }
                                      else {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -2,c_3);
                                        if (*puVar5 != '\0') goto LAB_0016e61a;
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,
                                                                    r_3 + -2,c_3);
                                        uVar4 = *puVar6;
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,
                                                                    c_3 + -2);
                                        uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                        *puVar6 = uVar4;
                                      }
                                      goto LAB_001704f8;
                                    }
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                                    if (*puVar5 != '\0') {
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1
                                                          ,c_3 + 1);
                                      if (*puVar5 != '\0') {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -2,c_3);
                                        if (*puVar5 == '\0') {
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,
                                                                      r_3 + -2,c_3);
                                          uVar4 = *puVar6;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                          *puVar6 = uVar4;
                                        }
                                        else {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + -2);
                                          if (*puVar5 == '\0') {
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                          }
                                          else {
LAB_00169eeb:
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -2,c_3 + -1);
                                            if (*puVar5 == '\0') {
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            else {
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3 + -2,
                                                                  c_3);
                                              iVar1 = *piVar7;
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                              *piVar7 = iVar1;
                                            }
                                          }
                                        }
                                        goto LAB_0016c89f;
                                      }
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3,
                                                          c_3 + 1);
                                      if (*puVar5 != '\0') goto LAB_0016b7e0;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                      iVar1 = *piVar7;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3);
                                      *piVar7 = iVar1;
LAB_0016cf9c:
                                      c_3 = c_3 + 2;
                                      if (c_3 < img.accesses_._88_4_ + -2) {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,r_3,
                                                            c_3);
                                        if (*puVar5 == '\0') {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + 1,c_3);
                                          if (*puVar5 == '\0') goto LAB_0016802f;
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,r_3,
                                                              c_3 + 1);
                                          if (*puVar5 == '\0') goto LAB_0016b4e7;
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + 1,c_3 + -1);
                                          if (*puVar5 == '\0') goto LAB_00167f7a;
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + 1);
                                          if (*puVar5 != '\0') {
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + -2);
                                            if (*puVar5 != '\0') goto LAB_0016c7d2;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                            goto LAB_0016abdd;
                                          }
                                        }
                                        else {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + 1,c_3 + -1);
                                          if (*puVar5 == '\0') goto LAB_00167b40;
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + 1);
                                          if (*puVar5 != '\0') {
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + -2);
                                            if (*puVar5 != '\0') goto LAB_0016bfaf;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                            goto LAB_0016c89f;
                                          }
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,r_3,
                                                              c_3 + 1);
                                          if (*puVar5 == '\0') {
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3);
                                            if (*puVar5 == '\0') {
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,
                                                                  c_3 + -2);
                                              iVar1 = *piVar7;
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                              *piVar7 = iVar1;
                                              goto LAB_0016bd3e;
                                            }
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + -2);
                                            if (*puVar5 != '\0') goto LAB_0016c5ab;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                            goto LAB_0016bed6;
                                          }
                                        }
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -1,c_3 + 2);
                                        if (*puVar5 == '\0') {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3);
                                          if (*puVar5 != '\0') {
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + -2);
                                            if (*puVar5 == '\0') {
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            else {
LAB_0016c42f:
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -2,c_3 + -1);
                                              if (*puVar5 == '\0') {
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3);
                                                uVar4 = *puVar6;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3 + -2);
                                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3);
                                                *puVar6 = uVar4;
                                              }
                                              else {
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,
                                                                    r_3 + -2,c_3);
                                                iVar1 = *piVar7;
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                                *piVar7 = iVar1;
                                              }
                                            }
LAB_00169e13:
                                            while (c_3 = c_3 + 2, c_3 < img.accesses_._88_4_ + -2) {
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3,c_3);
                                              if (*puVar5 != '\0') {
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -1,c_3 + 1);
                                                if (*puVar5 != '\0') {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -2,c_3);
                                                  if (*puVar5 != '\0') goto LAB_00169eeb;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,c_3
                                                                             );
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                  goto LAB_0016c89f;
                                                }
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3,c_3 + 1);
                                                if (*puVar5 == '\0') {
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                                  iVar1 = *piVar7;
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                                  *piVar7 = iVar1;
                                                  goto LAB_0016cf9c;
                                                }
LAB_0016a09e:
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -1,c_3 + 2);
                                                if (*puVar5 == '\0') {
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                                  iVar1 = *piVar7;
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                                  *piVar7 = iVar1;
                                                  goto LAB_0016b59a;
                                                }
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -2,c_3 + 1);
                                                if (*puVar5 == '\0') {
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,
                                                                              c_3 + 2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                }
                                                else {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -2,c_3);
                                                  if (*puVar5 != '\0') goto LAB_0016a149;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,
                                                                              c_3 + 2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                }
                                                goto LAB_0016a689;
                                              }
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + 1,c_3);
                                              if (*puVar5 == '\0') goto LAB_00169caa;
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3,c_3 + 1);
                                              if (*puVar5 != '\0') {
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -1,c_3 + 1);
                                                if (*puVar5 == '\0') goto LAB_0016a09e;
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -2,c_3);
                                                if (*puVar5 != '\0') goto LAB_0016a4bc;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3);
                                                uVar4 = *puVar6;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3 + -2);
                                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3);
                                                *puVar6 = uVar4;
                                                goto LAB_0016abdd;
                                              }
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,
                                                                  c_3 + -2);
                                              iVar1 = *piVar7;
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                              *piVar7 = iVar1;
LAB_0016b39c:
                                              c_3 = c_3 + 2;
                                              if (img.accesses_._88_4_ + -2 <= c_3) {
                                                if (img.accesses_._88_4_ + -2 < c_3) {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3,c_3);
                                                  if (*puVar5 == '\0') goto LAB_0016de97;
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + 1,c_3 + -1);
                                                  if (*puVar5 != '\0') goto LAB_0016db56;
                                                  goto LAB_0016d9ef;
                                                }
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3,c_3);
                                                if (*puVar5 != '\0') {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + 1,c_3 + -1);
                                                  if (*puVar5 != '\0') goto LAB_0016ebea;
                                                  goto LAB_0016e979;
                                                }
LAB_0016fad7:
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + 1,c_3);
                                                if (*puVar5 == '\0') goto LAB_0016e87e;
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3,c_3 + 1);
                                                if (*puVar5 == '\0') goto LAB_0016decf;
LAB_0016fb3d:
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + 1,c_3 + -1);
                                                if (*puVar5 != '\0') goto LAB_0016ef62;
                                                goto LAB_0016e75c;
                                              }
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3,c_3);
                                              if (*puVar5 != '\0') {
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + 1,c_3 + -1);
                                                if (*puVar5 == '\0') goto LAB_00168155;
LAB_00168936:
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -1,c_3 + 1);
                                                if (*puVar5 != '\0') {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3);
                                                  if (*puVar5 == '\0') {
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + -1,c_3 + -1);
                                                    if (*puVar5 == '\0') {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                    else {
                                                      puVar5 = MemMat<unsigned_char>::operator()
                                                                         ((MemMat<unsigned_char> *)
                                                                          local_e8,r_3 + -2,c_3);
                                                      if (*puVar5 == '\0') {
                                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                                   ((MemMat<int> *)
                                                                                    local_220,
                                                                                    r_3 + -2,c_3 + 
                                                  -2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,c_3
                                                                             );
                                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                  }
                                                  else {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                  }
                                                  goto LAB_0016c89f;
                                                }
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3,c_3 + 1);
                                                if (*puVar5 != '\0') {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3 + 2);
                                                  if (*puVar5 == '\0') {
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + -1,c_3 + -1);
                                                    if (*puVar5 == '\0') goto LAB_0016921e;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3 + -2);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                    goto LAB_0016b59a;
                                                  }
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3);
                                                  if (*puVar5 == '\0') {
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + -1,c_3 + -1);
                                                    if (*puVar5 == '\0') {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + 2);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                    else {
                                                      puVar5 = MemMat<unsigned_char>::operator()
                                                                         ((MemMat<unsigned_char> *)
                                                                          local_e8,r_3 + -2,c_3 + 1)
                                                      ;
                                                      if (*puVar5 == '\0') {
                                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                                   ((MemMat<int> *)
                                                                                    local_220,
                                                                                    r_3 + -2,c_3 + 
                                                  -2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,
                                                                              c_3 + 2);
                                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                  }
                                                  else {
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + -2,c_3);
                                                    if (*puVar5 == '\0') {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + -2);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + 2);
                                                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                    else {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + 2);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + -2,c_3 + 1);
                                                    if (*puVar5 == '\0') {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + 2);
                                                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                    else {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + 2);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                  }
                                                  goto LAB_0016a689;
                                                }
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -1,c_3 + -1);
                                                if (*puVar5 != '\0') {
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,
                                                                              c_3 + -2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                  goto LAB_0016cf9c;
                                                }
                                                while( true ) {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3);
                                                  if (*puVar5 != '\0') {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                    goto LAB_0016bed6;
                                                  }
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                                  iVar1 = *piVar7;
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                                  *piVar7 = iVar1;
LAB_0016bd3e:
                                                  c_3 = c_3 + 2;
                                                  if (img.accesses_._88_4_ + -2 <= c_3) {
                                                    if (c_3 <= img.accesses_._88_4_ + -2) {
                                                      puVar5 = MemMat<unsigned_char>::operator()
                                                                         ((MemMat<unsigned_char> *)
                                                                          local_e8,r_3,c_3);
                                                      if (*puVar5 == '\0') goto LAB_0016fad7;
                                                      goto LAB_0016fb3d;
                                                    }
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3,c_3);
                                                    if (*puVar5 == '\0') goto LAB_0016de97;
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + 1,c_3 + -1);
                                                    if (*puVar5 == '\0') goto LAB_0016d888;
                                                    goto LAB_0016dc12;
                                                  }
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3,c_3);
                                                  if (*puVar5 == '\0') break;
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + 1,c_3 + -1);
                                                  if (*puVar5 == '\0') goto LAB_00167b40;
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3 + 1);
                                                  if (*puVar5 != '\0') {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                    goto LAB_0016c89f;
                                                  }
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3,c_3 + 1);
                                                  if (*puVar5 != '\0') goto LAB_001695ef;
                                                }
                                              }
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + 1,c_3);
                                              if (*puVar5 == '\0') goto LAB_0016802f;
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3,c_3 + 1);
                                              if (*puVar5 == '\0') {
LAB_0016b4e7:
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + 1,c_3 + -1);
                                                if (*puVar5 == '\0') {
                                                  uVar4 = UFPC::MemNewLabel();
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                }
                                                else {
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                                  iVar1 = *piVar7;
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                                  *piVar7 = iVar1;
                                                }
                                                goto LAB_0016b39c;
                                              }
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + 1,c_3 + -1);
                                              if (*puVar5 == '\0') goto LAB_00167f7a;
LAB_0016953a:
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -1,c_3 + 1);
                                              if (*puVar5 != '\0') {
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3);
                                                uVar4 = *puVar6;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3 + -2);
                                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3);
                                                *puVar6 = uVar4;
                                                goto LAB_0016abdd;
                                              }
LAB_001695ef:
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -1,c_3 + 2);
                                              if (*puVar5 != '\0') {
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -2,c_3 + 1);
                                                if (*puVar5 == '\0') {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3);
                                                  if (*puVar5 == '\0') {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3 + 2);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                  }
                                                  else {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3 + 2);
                                                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                  }
                                                }
                                                else {
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,
                                                                              c_3 + 2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                }
                                                goto LAB_0016a689;
                                              }
LAB_0016921e:
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -1,c_3);
                                              if (*puVar5 == '\0') {
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,
                                                                    c_3 + -2);
                                                iVar1 = *piVar7;
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                                *piVar7 = iVar1;
                                                goto LAB_0016989f;
                                              }
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            if (img.accesses_._88_4_ + -2 < c_3) goto LAB_0016dda8;
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3,c_3);
                                            if (*puVar5 == '\0') {
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + 1,c_3);
                                              if (*puVar5 == '\0') goto LAB_0016f24b;
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3,c_3 + 1);
                                              if (*puVar5 == '\0') {
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,
                                                                    c_3 + -2);
                                                iVar1 = *piVar7;
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                                *piVar7 = iVar1;
                                                goto LAB_001704f8;
                                              }
                                            }
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + 1);
                                            if (*puVar5 == '\0') {
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,
                                                                  c_3 + -2);
                                              iVar1 = *piVar7;
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                              *piVar7 = iVar1;
                                            }
                                            else {
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -2,c_3);
                                              if (*puVar5 != '\0') goto LAB_0016e0b5;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            goto LAB_001704f8;
                                          }
                                          piVar7 = MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3 + -2)
                                          ;
                                          iVar1 = *piVar7;
                                          piVar7 = MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3);
                                          *piVar7 = iVar1;
                                          goto LAB_0016989f;
                                        }
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -2,c_3 + 1);
                                        if (*puVar5 == '\0') {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3);
                                          if (*puVar5 == '\0') {
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3 + 2);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                          }
                                          else {
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + -2);
                                            if (*puVar5 == '\0') {
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3 + 2);
                                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            else {
LAB_0016c208:
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -2,c_3 + -1);
                                              if (*puVar5 == '\0') {
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3);
                                                uVar4 = *puVar6;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3 + 2);
                                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3 + -2);
                                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3);
                                                *puVar6 = uVar4;
                                              }
                                              else {
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3 + 2);
                                                uVar4 = *puVar6;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3 + -2);
                                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3);
                                                *puVar6 = uVar4;
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + -2);
                                          if (*puVar5 != '\0') goto LAB_0016c114;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,
                                                                      r_3 + -2,c_3 + 2);
                                          uVar4 = *puVar6;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                          *puVar6 = uVar4;
                                        }
                                        goto LAB_0016a689;
                                      }
                                      if (img.accesses_._88_4_ + -2 < c_3) {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,r_3,
                                                            c_3);
                                        if (*puVar5 == '\0') goto LAB_0016de97;
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + 1,c_3 + -1);
                                        if (*puVar5 == '\0') goto LAB_0016d888;
                                      }
                                      else {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,r_3,
                                                            c_3);
                                        if (*puVar5 == '\0') {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + 1,c_3);
                                          if (*puVar5 == '\0') goto LAB_0016e87e;
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,r_3,
                                                              c_3 + 1);
                                          if (*puVar5 == '\0') goto LAB_0016decf;
                                        }
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + 1,c_3 + -1);
                                        if (*puVar5 == '\0') goto LAB_0016e75c;
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -1,c_3 + 1);
                                        if (*puVar5 != '\0') {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + -2);
                                          if (*puVar5 != '\0') goto LAB_0016fe8b;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,
                                                                      r_3 + -2,c_3);
                                          uVar4 = *puVar6;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                          *puVar6 = uVar4;
                                          goto LAB_001704f8;
                                        }
                                      }
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1
                                                          ,c_3);
                                      if (*puVar5 == '\0') {
                                        piVar7 = MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                        iVar1 = *piVar7;
                                        piVar7 = MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3);
                                        *piVar7 = iVar1;
                                        goto LAB_001704f8;
                                      }
LAB_0016e61a:
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1
                                                          ,c_3 + -2);
                                      if (*puVar5 != '\0') goto LAB_0016e0b5;
                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3 + -2,
                                                                  c_3);
                                      uVar4 = *puVar6;
                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,
                                                                  c_3 + -2);
                                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                      *puVar6 = uVar4;
                                      goto LAB_001704f8;
                                    }
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3 + 1,
                                                        c_3);
                                    if (*puVar5 == '\0') goto LAB_00169caa;
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3,
                                                        c_3 + 1);
                                    if (*puVar5 == '\0') {
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                      iVar1 = *piVar7;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3);
                                      *piVar7 = iVar1;
                                      goto LAB_0016b39c;
                                    }
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                        c_3 + 1);
                                    if (*puVar5 != '\0') {
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -2
                                                          ,c_3);
                                      if (*puVar5 == '\0') {
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,
                                                                    r_3 + -2,c_3);
                                        uVar4 = *puVar6;
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,
                                                                    c_3 + -2);
                                        uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                        *puVar6 = uVar4;
                                      }
                                      else {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -1,c_3 + -2);
                                        if (*puVar5 == '\0') {
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,
                                                                      r_3 + -2,c_3);
                                          uVar4 = *puVar6;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                          *puVar6 = uVar4;
                                        }
                                        else {
LAB_0016a4bc:
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -2,c_3 + -1);
                                          if (*puVar5 == '\0') {
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                          }
                                          else {
                                            piVar7 = MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_3 + -2,
                                                                c_3);
                                            iVar1 = *piVar7;
                                            piVar7 = MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_3,c_3);
                                            *piVar7 = iVar1;
                                          }
                                        }
                                      }
                                      goto LAB_0016abdd;
                                    }
LAB_0016b7e0:
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                        c_3 + 2);
                                    if (*puVar5 != '\0') {
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -2
                                                          ,c_3 + 1);
                                      if (*puVar5 == '\0') {
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,
                                                                    r_3 + -2,c_3 + 2);
                                        uVar4 = *puVar6;
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,
                                                                    c_3 + -2);
                                        uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                        *puVar6 = uVar4;
                                      }
                                      else {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -2,c_3);
                                        if (*puVar5 == '\0') {
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,
                                                                      r_3 + -2,c_3 + 2);
                                          uVar4 = *puVar6;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                          *puVar6 = uVar4;
                                        }
                                        else {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + -2);
                                          if (*puVar5 == '\0') {
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3 + 2);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                          }
                                          else {
LAB_0016a149:
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -2,c_3 + -1);
                                            if (*puVar5 == '\0') {
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3 + 2);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            else {
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3 + -2,
                                                                  c_3 + 2);
                                              iVar1 = *piVar7;
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                              *piVar7 = iVar1;
                                            }
                                          }
                                        }
                                      }
                                      goto LAB_0016a689;
                                    }
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                                    *piVar7 = iVar1;
                                  } while( true );
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -2,
                                                    c_3 + 1);
                                if (*puVar5 == '\0') {
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3 + -2,
                                                              c_3 + 2);
                                  uVar4 = *puVar6;
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3 + -2)
                                  ;
                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3);
                                  *puVar6 = uVar4;
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                              }
                            } while( true );
                          }
LAB_0016c0a0:
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
                          if (*puVar5 != '\0') {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + 1);
                            if (*puVar5 != '\0') goto LAB_0016c114;
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                            if (*puVar5 != '\0') goto LAB_0016c208;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                            uVar4 = *puVar6;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                            *puVar6 = uVar4;
                            goto LAB_0016a689;
                          }
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                          if (*puVar5 != '\0') goto LAB_0016c42f;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                          *piVar7 = iVar1;
                          goto LAB_0016989f;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                        if (*puVar5 == '\0') goto LAB_00167b40;
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                        if (*puVar5 != '\0') {
LAB_0016bfaf:
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + -1);
                          if (*puVar5 == '\0') {
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3 + -2,c_3);
                            uVar4 = *puVar6;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                            *puVar6 = uVar4;
                          }
                          else {
LAB_0016ac80:
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                            if (*puVar5 == '\0') {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
                              if (*puVar5 == '\0') {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3);
                                *puVar6 = uVar4;
                              }
                              else {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                                *piVar7 = iVar1;
                              }
                            }
                            else {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3 + -2,c_3);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                              *piVar7 = iVar1;
                            }
                          }
                          goto LAB_0016c89f;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                        if (*puVar5 != '\0') goto LAB_0016c0a0;
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                          *piVar7 = iVar1;
                          goto LAB_0016bd3e;
                        }
LAB_0016c5ab:
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + -1);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                          ;
                          *puVar6 = uVar4;
                        }
                        else {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                          *piVar7 = iVar1;
                        }
                      } while( true );
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
                    if (*puVar5 != '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                      if (*puVar5 != '\0') goto LAB_00167c65;
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                      if (*puVar5 == '\0') {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                        goto LAB_0016a689;
                      }
                      goto LAB_00168466;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                    if (*puVar5 != '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                      goto LAB_00169e13;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                    if (*puVar5 == '\0') {
                      uVar4 = UFPC::MemNewLabel();
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                    goto LAB_0016989f;
                  }
                  if (img.accesses_._88_4_ + -2 < c_3) {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                    if (*puVar5 == '\0') goto LAB_0016d933;
                  }
                  else {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                    if (*puVar5 == '\0') goto LAB_0016e7e1;
LAB_0016e979:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                    if (*puVar5 != '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                      if (*puVar5 == '\0') {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                        if (*puVar5 != '\0') goto LAB_0016ea65;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                      }
                      else {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                      }
                      goto LAB_001704f8;
                    }
                  }
LAB_0016d9ef:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                  if (*puVar5 == '\0') {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                    if (*puVar5 == '\0') {
                      uVar4 = UFPC::MemNewLabel();
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                  }
                  goto LAB_001704f8;
                }
                uVar4 = UFPC::MemNewLabel();
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *puVar6 = uVar4;
                c_3 = c_3 + 2;
                if (c_3 < img.accesses_._88_4_ + -2) {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                  if (*puVar5 != '\0') goto LAB_00168936;
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                  if (*puVar5 == '\0') goto LAB_0016802f;
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                  if (*puVar5 != '\0') goto LAB_0016953a;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                  goto LAB_0016b39c;
                }
                if (img.accesses_._88_4_ + -2 < c_3) {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                  if (*puVar5 == '\0') goto LAB_0016dd0c;
LAB_0016db56:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                  if (*puVar5 != '\0') {
                    puVar6 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                    uVar4 = *puVar6;
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *puVar6 = uVar4;
                    goto LAB_001704f8;
                  }
                }
                else {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                  if (*puVar5 != '\0') {
LAB_0016ebea:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                    if (*puVar5 == '\0') goto LAB_0016db56;
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                    if (*puVar5 == '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                      if (*puVar5 == '\0') {
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3 + -2,c_3);
                        uVar4 = *puVar6;
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3,c_3 + -2);
                        uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *puVar6 = uVar4;
                      }
                      else {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                          ;
                          *puVar6 = uVar4;
                        }
                        else {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                          ;
                          *puVar6 = uVar4;
                        }
                      }
                    }
                    else {
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3 + -2,c_3);
                      uVar4 = *puVar6;
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3,c_3 + -2);
                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *puVar6 = uVar4;
                    }
                    goto LAB_001704f8;
                  }
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                  if (*puVar5 == '\0') goto LAB_0016e87e;
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                    goto LAB_001704f8;
                  }
LAB_0016ef62:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                  if (*puVar5 != '\0') {
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                    uVar4 = *puVar6;
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *puVar6 = uVar4;
                    goto LAB_001704f8;
                  }
                }
LAB_0016dc12:
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
                else {
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                  uVar4 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *puVar6 = uVar4;
                }
                goto LAB_001704f8;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
              if (*puVar5 != '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_0016abdd;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
              if (*puVar5 != '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_0016a689;
              }
              uVar4 = UFPC::MemNewLabel();
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *puVar6 = uVar4;
            } while( true );
          }
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1)
          ;
          if (*puVar5 != '\0') goto LAB_0016ac46;
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
          if (*puVar5 != '\0') goto LAB_0016ac46;
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
          if (*puVar5 == '\0') {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
              if (*puVar5 == '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_0016bd3e;
              }
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
              goto LAB_0016bed6;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
            if (*puVar5 != '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
              if (*puVar5 != '\0') goto LAB_00167c65;
LAB_00168466:
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + 1);
              if (*puVar5 == '\0') {
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2)
                ;
                uVar4 = *puVar6;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *puVar6 = uVar4;
                goto LAB_0016a689;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
              if (*puVar5 != '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_0016a689;
              }
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
              uVar4 = *puVar6;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *puVar6 = uVar4;
              goto LAB_0016a689;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
            if (*puVar5 != '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
              goto LAB_00169e13;
            }
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *piVar7 = iVar1;
            goto LAB_0016989f;
          }
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3)
          ;
          if (*puVar5 == '\0') {
LAB_00168241:
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
            if (*puVar5 == '\0') {
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
              uVar4 = *puVar6;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *puVar6 = uVar4;
            }
            else {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
            }
          }
          else {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *piVar7 = iVar1;
          }
        } while( true );
      }
      if (img.accesses_._88_4_ + -2 < 0) {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,0);
        if (*puVar5 == '\0') {
LAB_0016d933:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *piVar7 = 0;
          }
          else {
            uVar4 = UFPC::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *puVar6 = uVar4;
          }
          goto LAB_001704f8;
        }
LAB_0016d888:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
        if (*puVar5 == '\0') {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
          *puVar6 = uVar4;
        }
        else {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
          *piVar7 = iVar1;
        }
      }
      else {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,0);
        if (*puVar5 == '\0') {
LAB_0016e7e1:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
          if (*puVar5 == '\0') {
LAB_0016e87e:
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
            if (*puVar5 != '\0') goto LAB_0016e75c;
LAB_0016e8b7:
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + 1);
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = 0;
            }
            else {
              uVar4 = UFPC::MemNewLabel();
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *puVar6 = uVar4;
            }
          }
          else {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
            if (*puVar5 != '\0') goto LAB_0016e75c;
            uVar4 = UFPC::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *puVar6 = uVar4;
          }
        }
        else {
LAB_0016e75c:
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
          if (*puVar5 == '\0') goto LAB_0016d888;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
          *piVar7 = iVar1;
        }
      }
LAB_001704f8:
    }
    if ((int)img.accesses_._92_4_ % 2 == 1) {
      r_4 = img.accesses_._92_4_ + -1;
      c_4 = -2;
LAB_00170536:
      c_4 = c_4 + 2;
      if (c_4 < img.accesses_._88_4_ + -2) {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4);
        if (*puVar5 == '\0') goto LAB_00170969;
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
        if (*puVar5 != '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
          *piVar7 = iVar1;
LAB_0017259f:
          do {
            c_4 = c_4 + 2;
            if (img.accesses_._88_4_ + -2 <= c_4) {
              if (img.accesses_._88_4_ + -2 < c_4) {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                  *piVar7 = 0;
                  goto LAB_00174243;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + -1);
                if (*puVar5 != '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                  *piVar7 = iVar1;
                  goto LAB_00174243;
                }
              }
              else {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                if (*puVar5 == '\0') goto LAB_001733cb;
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + -1);
                if (*puVar5 != '\0') {
LAB_00173cf7:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                    *piVar7 = iVar1;
                  }
                  else {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                    if (*puVar5 == '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                      if (*puVar5 == '\0') {
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4 + -2,c_4);
                        uVar4 = *puVar6;
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4,c_4 + -2);
                        uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *puVar6 = uVar4;
                      }
                      else {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *piVar7 = iVar1;
                      }
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                    }
                  }
                  goto LAB_00174243;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                if (*puVar5 != '\0') {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                  if (*puVar5 == '\0') {
LAB_00173547:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                    if (*puVar5 == '\0') {
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                      uVar4 = *puVar6;
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4);
                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                    *piVar7 = iVar1;
                  }
                  goto LAB_00174243;
                }
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
              if (*puVar5 == '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *piVar7 = iVar1;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *piVar7 = iVar1;
              }
              goto LAB_00174243;
            }
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4);
            if (*puVar5 == '\0') goto LAB_00170969;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + -1);
            if (*puVar5 != '\0') goto LAB_001720b7;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
              if (*puVar5 != '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                if (*puVar5 == '\0') {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                    *piVar7 = iVar1;
                    goto LAB_0017121d;
                  }
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                  *piVar7 = iVar1;
                  goto LAB_00171641;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                if (*puVar5 != '\0') goto LAB_001706c2;
LAB_00170db6:
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
                if (*puVar5 == '\0') {
                  puVar6 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                  uVar4 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                  *puVar6 = uVar4;
                }
                else {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                  if (*puVar5 == '\0') {
                    puVar6 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                    uVar4 = *puVar6;
                    puVar6 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                    *puVar6 = uVar4;
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                    *piVar7 = iVar1;
                  }
                }
LAB_00171c13:
                do {
                  c_4 = c_4 + 2;
                  if (img.accesses_._88_4_ + -2 <= c_4) {
                    if (img.accesses_._88_4_ + -2 < c_4) {
LAB_001730e7:
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                      if (*puVar5 == '\0') {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *piVar7 = 0;
                      }
                      else {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *piVar7 = iVar1;
                      }
                    }
                    else {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                      if (*puVar5 == '\0') {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = 0;
                        }
                        else {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                        }
                      }
                      else {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                        }
                        else {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                        }
                      }
                    }
                    goto LAB_00174243;
                  }
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                  if (*puVar5 == '\0') {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = 0;
                      goto LAB_00170a3e;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                    if (*puVar5 != '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                      goto LAB_0017204e;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                      goto LAB_00171641;
                    }
LAB_001706c2:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
                    if (*puVar5 == '\0') {
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4);
                      uVar4 = *puVar6;
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                    if (*puVar5 != '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                      goto LAB_0017259f;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                      goto LAB_00170536;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
LAB_00172926:
                      c_4 = c_4 + 2;
                      if (img.accesses_._88_4_ + -2 <= c_4) {
                        if (img.accesses_._88_4_ + -2 < c_4) goto LAB_001730e7;
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                        if (*puVar5 == '\0') {
LAB_001737c4:
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                          if (*puVar5 == '\0') {
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                            *piVar7 = 0;
                          }
                          else {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                            if (*puVar5 == '\0') {
                              uVar4 = UFPC::MemNewLabel();
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                              *puVar6 = uVar4;
                            }
                            else {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                              *piVar7 = iVar1;
                            }
                          }
                        }
                        else {
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                          if (*puVar5 == '\0') {
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                            iVar1 = *piVar7;
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                            *piVar7 = iVar1;
                          }
                          else {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                            if (*puVar5 == '\0') {
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4);
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4 + -2);
                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                              *puVar6 = uVar4;
                            }
                            else {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                  c_4 + -2);
                              if (*puVar5 == '\0') {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4);
                                *puVar6 = uVar4;
                              }
                              else {
LAB_0017396c:
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -2,
                                                    c_4 + -1);
                                if (*puVar5 == '\0') {
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_4 + -2,
                                                              c_4 + -2);
                                  uVar4 = *puVar6;
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_4 + -2,c_4)
                                  ;
                                  uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_4,c_4);
                                  *puVar6 = uVar4;
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                                  ;
                                  *piVar7 = iVar1;
                                }
                              }
                            }
                          }
                        }
                        goto LAB_00174243;
                      }
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                      if (*puVar5 == '\0') {
                        do {
                          while( true ) {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                            if (*puVar5 == '\0') {
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                              *piVar7 = 0;
                              goto LAB_00170a3e;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                            if (*puVar5 != '\0') break;
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                            if (*puVar5 != '\0') {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                              *piVar7 = iVar1;
                              goto LAB_00171c13;
                            }
                            uVar4 = UFPC::MemNewLabel();
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                            *puVar6 = uVar4;
LAB_0017121d:
                            c_4 = c_4 + 2;
                            if (img.accesses_._88_4_ + -2 <= c_4) {
                              if (img.accesses_._88_4_ + -2 < c_4) goto LAB_001730e7;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                              if (*puVar5 == '\0') goto LAB_001737c4;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1
                                                 );
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                                *piVar7 = iVar1;
                              }
                              else {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4);
                                *puVar6 = uVar4;
                              }
                              goto LAB_00174243;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                            if (*puVar5 != '\0') {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1
                                                 );
                              if (*puVar5 != '\0') {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4);
                                *puVar6 = uVar4;
                                goto LAB_0017259f;
                              }
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                                *piVar7 = iVar1;
                                goto LAB_00170536;
                              }
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2
                                                 );
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                                *piVar7 = iVar1;
                                goto LAB_00172926;
                              }
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2)
                              ;
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4 + -2);
                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                              *puVar6 = uVar4;
                              goto LAB_00171c13;
                            }
                          }
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
LAB_0017204e:
                          while( true ) {
                            c_4 = c_4 + 2;
                            if (img.accesses_._88_4_ + -2 <= c_4) {
                              if (img.accesses_._88_4_ + -2 < c_4) goto LAB_001730e7;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                              if (*puVar5 == '\0') goto LAB_001733cb;
                              goto LAB_00173cf7;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                            if (*puVar5 != '\0') goto LAB_001720b7;
LAB_00170969:
                            while (puVar5 = MemMat<unsigned_char>::operator()
                                                      ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1
                                                      ), *puVar5 == '\0') {
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                              *piVar7 = 0;
LAB_00170a3e:
                              c_4 = c_4 + 2;
                              if (img.accesses_._88_4_ + -2 <= c_4) {
                                if (img.accesses_._88_4_ + -2 < c_4) {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                                  if (*puVar5 == '\0') {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = 0;
                                    goto LAB_00174243;
                                  }
                                }
                                else {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                                  if (*puVar5 == '\0') goto LAB_001733cb;
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                      c_4 + 1);
                                  if (*puVar5 != '\0') {
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                        c_4);
                                    if (*puVar5 == '\0') {
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_4 + -1
                                                          ,c_4 + -1);
                                      if (*puVar5 != '\0') goto LAB_00173547;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                      iVar1 = *piVar7;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                                      *piVar7 = iVar1;
                                    }
                                    else {
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                      iVar1 = *piVar7;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                                      *piVar7 = iVar1;
                                    }
                                    goto LAB_00174243;
                                  }
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                                if (*puVar5 == '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                      c_4 + -1);
                                  if (*puVar5 == '\0') {
                                    uVar4 = UFPC::MemNewLabel();
                                    puVar6 = (uint *)MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_4,c_4);
                                    *puVar6 = uVar4;
                                  }
                                  else {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                  }
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                                  ;
                                  *piVar7 = iVar1;
                                }
                                goto LAB_00174243;
                              }
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                              if (*puVar5 != '\0') {
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                    c_4 + 1);
                                if (*puVar5 != '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4
                                                     );
                                  if (*puVar5 == '\0') {
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                        c_4 + -1);
                                    if (*puVar5 != '\0') goto LAB_00170b91;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                  }
                                  else {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                  }
                                  goto LAB_0017259f;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                                if (*puVar5 == '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4
                                                     );
                                  if (*puVar5 == '\0') {
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                        c_4 + -1);
                                    if (*puVar5 == '\0') {
                                      uVar4 = UFPC::MemNewLabel();
                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_4,c_4);
                                      *puVar6 = uVar4;
                                    }
                                    else {
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2
                                                         );
                                      iVar1 = *piVar7;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                                      *piVar7 = iVar1;
                                    }
                                  }
                                  else {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                  }
                                  goto LAB_00170536;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                    c_4 + 2);
                                if (*puVar5 == '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4
                                                     );
                                  if (*puVar5 != '\0') {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                    goto LAB_00171641;
                                  }
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                      c_4 + -1);
                                  if (*puVar5 == '\0') {
                                    uVar4 = UFPC::MemNewLabel();
                                    puVar6 = (uint *)MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_4,c_4);
                                    *puVar6 = uVar4;
                                  }
                                  else {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                  }
                                  goto LAB_0017121d;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                                if (*puVar5 != '\0') goto LAB_001706c2;
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                    c_4 + -1);
                                if (*puVar5 != '\0') goto LAB_00170db6;
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                                *piVar7 = iVar1;
                                goto LAB_00171c13;
                              }
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                            if (*puVar5 == '\0') break;
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                            iVar1 = *piVar7;
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                            *piVar7 = iVar1;
                          }
LAB_00170651:
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                          if (*puVar5 != '\0') {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                            if (*puVar5 != '\0') goto LAB_001706c2;
                            piVar7 = MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                            iVar1 = *piVar7;
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                            *piVar7 = iVar1;
                            goto LAB_00171c13;
                          }
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                          if (*puVar5 == '\0') {
                            uVar4 = UFPC::MemNewLabel();
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                            *puVar6 = uVar4;
                            goto LAB_0017121d;
                          }
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
LAB_00171641:
                          c_4 = c_4 + 2;
                          if (img.accesses_._88_4_ + -2 <= c_4) {
                            if (img.accesses_._88_4_ + -2 < c_4) goto LAB_001730e7;
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                            if (*puVar5 == '\0') goto LAB_001737c4;
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                            if (*puVar5 == '\0') {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4,c_4 + -2);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                              *piVar7 = iVar1;
                            }
                            else {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                              if (*puVar5 != '\0') goto LAB_0017396c;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4);
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4 + -2);
                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                              *puVar6 = uVar4;
                            }
                            goto LAB_00174243;
                          }
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                        } while (*puVar5 == '\0');
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                        if (*puVar5 != '\0') {
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                          if (*puVar5 != '\0') goto LAB_00171719;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_0017259f;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                          goto LAB_00170536;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                          goto LAB_00172926;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_00171c13;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_00171c13;
                        }
                      }
                      else {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                        if (*puVar5 != '\0') {
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                          if (*puVar5 == '\0') {
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4);
                            uVar4 = *puVar6;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4 + -2);
                            uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                            *puVar6 = uVar4;
                          }
                          else {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + -2)
                            ;
                            if (*puVar5 == '\0') {
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4);
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4 + -2);
                              uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                              *puVar6 = uVar4;
                            }
                            else {
LAB_00171719:
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -2,
                                                  c_4 + -1);
                              if (*puVar5 == '\0') {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4 + -2,
                                                            c_4 + -2);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4);
                                *puVar6 = uVar4;
                              }
                              else {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                                *piVar7 = iVar1;
                              }
                            }
                          }
                          goto LAB_0017259f;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                          goto LAB_00170536;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                          goto LAB_00172926;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_00171c13;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_00171c13;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + -2);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_00171c13;
                        }
                      }
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + -1);
                      if (*puVar5 == '\0') {
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                        uVar4 = *puVar6;
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4,c_4 + -2);
                        uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *puVar6 = uVar4;
                      }
                      else {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *piVar7 = iVar1;
                      }
                      goto LAB_00171c13;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
                    if (*puVar5 == '\0') {
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                      uVar4 = *puVar6;
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4,c_4 + -2);
                      uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                    }
                  }
                } while( true );
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
              if (*puVar5 == '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *piVar7 = iVar1;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *piVar7 = iVar1;
              }
              goto LAB_00170536;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
            if (*puVar5 == '\0') {
LAB_00170b91:
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
              if (*puVar5 == '\0') {
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + -2)
                ;
                uVar4 = *puVar6;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                uVar4 = UFPC::MemMerge(uVar4,*puVar6);
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *puVar6 = uVar4;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *piVar7 = iVar1;
              }
            }
            else {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
              *piVar7 = iVar1;
            }
          } while( true );
        }
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
        if (*puVar5 != '\0') goto LAB_00170651;
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
        if (*puVar5 == '\0') {
          uVar4 = UFPC::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
          *puVar6 = uVar4;
        }
        else {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
          *piVar7 = iVar1;
        }
        goto LAB_00170536;
      }
      if (img.accesses_._88_4_ + -2 < c_4) {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4);
        if (*puVar5 == '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
          *piVar7 = 0;
          goto LAB_00174243;
        }
      }
      else {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4);
        if (*puVar5 == '\0') {
LAB_001733cb:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
            *piVar7 = 0;
            goto LAB_00174243;
          }
        }
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
        if (*puVar5 != '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
          *piVar7 = iVar1;
          goto LAB_00174243;
        }
      }
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
      if (*puVar5 == '\0') {
        uVar4 = UFPC::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *puVar6 = uVar4;
      }
      else {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
        iVar1 = *piVar7;
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *piVar7 = iVar1;
      }
    }
  }
LAB_00174243:
  uVar4 = UFPC::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
  for (iLabel = 0; iLabel < (int)img.accesses_._92_4_; iLabel = iLabel + 2) {
    for (local_250 = 0; local_250 < (int)img.accesses_._88_4_; local_250 = local_250 + 2) {
      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250);
      local_254 = *puVar6;
      if ((int)local_254 < 1) {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250);
        *piVar7 = 0;
        if (local_250 + 1 < (int)img.accesses_._88_4_) {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250 + 1);
          *piVar7 = 0;
          if (iLabel + 1 < (int)img.accesses_._92_4_) {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250);
            *piVar7 = 0;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250 + 1);
            *piVar7 = 0;
          }
        }
        else if (iLabel + 1 < (int)img.accesses_._92_4_) {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250);
          *piVar7 = 0;
        }
      }
      else {
        local_254 = UFPC::MemGetLabel(local_254);
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e8,iLabel,local_250);
        uVar4 = local_254;
        if (*puVar5 == '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250);
          *piVar7 = 0;
        }
        else {
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250);
          *puVar6 = uVar4;
        }
        if (local_250 + 1 < (int)img.accesses_._88_4_) {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,iLabel,local_250 + 1);
          uVar4 = local_254;
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250 + 1);
            *piVar7 = 0;
          }
          else {
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250 + 1);
            *puVar6 = uVar4;
          }
          if (iLabel + 1 < (int)img.accesses_._92_4_) {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,iLabel + 1,local_250);
            uVar4 = local_254;
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250);
              *piVar7 = 0;
            }
            else {
              puVar6 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_220,iLabel + 1,local_250);
              *puVar6 = uVar4;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,iLabel + 1,local_250 + 1);
            uVar4 = local_254;
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250 + 1);
              *piVar7 = 0;
            }
            else {
              puVar6 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_220,iLabel + 1,local_250 + 1);
              *puVar6 = uVar4;
            }
          }
        }
        else if (iLabel + 1 < (int)img.accesses_._92_4_) {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,iLabel + 1,local_250);
          uVar4 = local_254;
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250);
            *piVar7 = 0;
          }
          else {
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250);
            *puVar6 = uVar4;
          }
        }
      }
    }
  }
  local_278 = 0;
  std::allocator<unsigned_long>::allocator(&local_279);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_270,4,&local_278,&local_279);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(accesses,&local_270);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_270);
  std::allocator<unsigned_long>::~allocator(&local_279);
  dVar9 = MemMat<unsigned_char>::GetTotalAccesses((MemMat<unsigned_char> *)local_e8);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,0);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = MemMat<int>::GetTotalAccesses((MemMat<int> *)local_220);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,1);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = UFPC::MemTotalAccesses();
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,2);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  MemMat<int>::GetImage(&local_2e0,(MemMat<int> *)local_220);
  cv::Mat_<int>::operator=
            ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_2e0);
  cv::Mat_<int>::~Mat_(&local_2e0);
  UFPC::MemDealloc();
  MemMat<int>::~MemMat((MemMat<int> *)local_220);
  MemMat<unsigned_char>::~MemMat((MemMat<unsigned_char> *)local_e8);
  return;
LAB_0016802f:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
  if (*puVar5 == '\0') goto LAB_00168068;
LAB_00167f7a:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
  if (*puVar5 != '\0') {
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
    iVar1 = *piVar7;
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
    *piVar7 = iVar1;
    goto LAB_0016abdd;
  }
LAB_00167bf4:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
  if (*puVar5 != '\0') {
    puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
    if (*puVar5 != '\0') goto LAB_00167c65;
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
    iVar1 = *piVar7;
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
    *piVar7 = iVar1;
    goto LAB_0016a689;
  }
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
  if (*puVar5 == '\0') {
    uVar4 = UFPC::MemNewLabel();
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
    *puVar6 = uVar4;
    goto LAB_0016989f;
  }
  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
  iVar1 = *piVar7;
  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
  *piVar7 = iVar1;
  goto LAB_00169e13;
LAB_0016c114:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + -1);
  if (*puVar5 == '\0') {
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
    uVar4 = *puVar6;
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
    *puVar6 = uVar4;
    goto LAB_0016a689;
  }
  goto LAB_0016aea2;
LAB_001720b7:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
  if (*puVar5 != '\0') {
    puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
    if (*puVar5 == '\0') {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
      if (*puVar5 == '\0') {
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
        uVar4 = *puVar6;
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
        uVar4 = UFPC::MemMerge(uVar4,*puVar6);
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *puVar6 = uVar4;
      }
      else {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
        iVar1 = *piVar7;
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *piVar7 = iVar1;
      }
    }
    else {
      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
      iVar1 = *piVar7;
      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
      *piVar7 = iVar1;
    }
    goto LAB_0017259f;
  }
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
  if (*puVar5 == '\0') {
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
    iVar1 = *piVar7;
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
    *piVar7 = iVar1;
    goto LAB_00170536;
  }
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
  if (*puVar5 != '\0') goto code_r0x001722d2;
  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
  iVar1 = *piVar7;
  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
  *piVar7 = iVar1;
  goto LAB_00172926;
code_r0x001722d2:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
  if (*puVar5 == '\0') {
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
    uVar4 = *puVar6;
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
    uVar4 = UFPC::MemMerge(uVar4,*puVar6);
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
    *puVar6 = uVar4;
  }
  else {
    puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
    if (*puVar5 == '\0') {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
      if (*puVar5 == '\0') {
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
        uVar4 = *puVar6;
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
        uVar4 = UFPC::MemMerge(uVar4,*puVar6);
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *puVar6 = uVar4;
      }
      else {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
        iVar1 = *piVar7;
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *piVar7 = iVar1;
      }
    }
    else {
      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
      iVar1 = *piVar7;
      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
      *piVar7 = iVar1;
    }
  }
  goto LAB_00171c13;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
	{
		const int h = img_.rows;
		const int w = img_.cols;

		LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
		LabelsSolver::MemSetup();

		//Data structure for memory test
		MemMat<unsigned char> img(img_);
		MemMat<int> img_labels(img_.size(), 0);

		// We work with 2x2 blocks
		// +-+-+-+
		// |P|Q|R|
		// +-+-+-+
		// |S|X|
		// +-+-+

		// The pixels are named as follows
		// +---+---+---+
		// |a b|c d|e f|
		// |g h|i j|k l|
		// +---+---+---+
		// |m n|o p|
		// |q r|s t|
		// +---+---+

		// Pixels a, f, l, q are not needed, since we need to understand the
		// the connectivity between these blocks and those pixels only metter
		// when considering the outer connectivities

		// A bunch of defines used to check if the pixels are foreground,
		// without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

				// Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
				// Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
				//Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
				// Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
				// Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
				// Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
				// Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
				//Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
				// Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
				// Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
				// Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
				// Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
				// Action 13: not used
#define ACTION_13 
				// Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
				//Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
				//Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


		if (h == 1) {
			// Single line
			int r = 0;
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				int r = 0;
				int c = -2;
#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < h - (h % 2); r += 2) {
				int c = -2;
				goto tree_0;
#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case that the rows are odd)
			if ((h % 2) == 1)
			{
				int r = h - 1;
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}

		n_labels_ = LabelsSolver::MemFlatten();

		// Second scan
		for (int r = 0; r < h; r += 2) {
			for (int c = 0; c < w; c += 2) {
				int iLabel = img_labels(r, c);
				if (iLabel > 0) {
					iLabel = LabelsSolver::MemGetLabel(iLabel);
					if (img(r, c) > 0)
						img_labels(r, c) = iLabel;
					else
						img_labels(r, c) = 0;
					if (c + 1 < w) {
						if (img(r, c + 1) > 0)
							img_labels(r, c + 1) = iLabel;
						else
							img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							if (img(r + 1, c) > 0)
								img_labels(r + 1, c) = iLabel;
							else
								img_labels(r + 1, c) = 0;
							if (img(r + 1, c + 1) > 0)
								img_labels(r + 1, c + 1) = iLabel;
							else
								img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						if (img(r + 1, c) > 0)
							img_labels(r + 1, c) = iLabel;
						else
							img_labels(r + 1, c) = 0;
					}
				}
				else {
					img_labels(r, c) = 0;
					if (c + 1 < w) {
						img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							img_labels(r + 1, c) = 0;
							img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						img_labels(r + 1, c) = 0;
					}
				}
			}
		}

		// Store total accesses in the output vector 'accesses'
		accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

		accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
		accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
		accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

		img_labels_ = img_labels.GetImage();

		LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
	}